

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int isok;
  int num;
  char **argv_local;
  int argc_local;
  
  inimenu();
  iniVIP();
  welcome();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    int num = 0, isok = 0;
    inimenu();
    iniVIP();
    welcome();
    frame
    return 0;
}